

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<int,_true>_> *
immutable::rrb_details::new_editable_path<int,true,5>
          (ref<immutable::rrb_details::internal_node<int,_true>_> *to_set,uint32_t empty_height,
          guid_type guid)

{
  internal_node<int,_true> *piVar1;
  internal_node<int,_true> *piVar2;
  int iVar3;
  ref<immutable::rrb_details::internal_node<int,_true>_> empty;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_empty;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_50;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_48;
  internal_node<int,_true> *local_40;
  ref<immutable::rrb_details::internal_node<int,_true>_> *local_38;
  
  if (empty_height != 0) {
    local_38 = to_set;
    piVar1 = (internal_node<int,_true> *)malloc(0x120);
    piVar1->type = INTERNAL_NODE;
    piVar1->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(piVar1 + 1);
    (piVar1->size_table).ptr = (rrb_size_table<true> *)0x0;
    memset(piVar1 + 1,0,0x100);
    piVar1->guid = guid;
    piVar1->len = 1;
    LOCK();
    (piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    local_50.ptr = piVar1;
    local_40 = piVar1;
    if (empty_height != 1) {
      iVar3 = empty_height - 1;
      do {
        piVar2 = (internal_node<int,_true> *)malloc(0x120);
        piVar2->type = INTERNAL_NODE;
        piVar2->len = 0;
        piVar1 = piVar2 + 1;
        piVar2->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)piVar1;
        (piVar2->size_table).ptr = (rrb_size_table<true> *)0x0;
        memset(piVar1,0,0x100);
        LOCK();
        (piVar2->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
        piVar2->len = 1;
        piVar2->guid = guid;
        local_48.ptr = piVar2;
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)piVar1,&local_50);
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(&local_50,&local_48);
        release<int>(local_48.ptr);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(local_38,&local_50);
    to_set = local_40->child;
    release<int>(local_50.ptr);
  }
  return to_set;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* new_editable_path(ref<internal_node<T, atomic_ref_counting>>* to_set, uint32_t empty_height, guid_type guid)
      {
      if (0 < empty_height)
        {
        internal_node<T, atomic_ref_counting>* leaf = transient_internal_node_create<T, atomic_ref_counting, N>();
        leaf->guid = guid;
        leaf->len = 1;

        ref<internal_node<T, atomic_ref_counting>> empty = leaf;
        for (uint32_t i = 1; i < empty_height; i++)
          {
          ref<internal_node<T, atomic_ref_counting>> new_empty = transient_internal_node_create<T, atomic_ref_counting, N>();
          new_empty->len = 1;
          new_empty->guid = guid;
          new_empty->child[0] = empty;
          empty = new_empty;
          }
        *to_set = empty;
        return &leaf->child[0];
        }
      else
        {
        return to_set;
        }
      }